

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::replaceSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Directory **this_00;
  size_t sVar1;
  String *pSVar2;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar3;
  Directory *pDVar4;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *extraout_RDX_01;
  Replacer<kj::Directory> *pRVar5;
  uint in_R8D;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> OVar6;
  StringPtr name;
  undefined1 local_d8 [16];
  undefined1 local_c8 [48];
  Own<const_kj::Directory,_std::nullptr_t> *child;
  WriteMode local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _child1209;
  undefined1 local_58 [40];
  Fault f;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (InMemoryDirectory *)path.parts.size_;
  name.content.ptr = (InMemoryDirectory *)path.parts.ptr;
  f.exception._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)(local_58 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x4b3,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::~Fault((Fault *)(local_58 + 0x20));
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
                (&(name.content.ptr)->impl);
      this_00 = &_child1209.value.ptr;
      Impl::newDirectory((Impl *)this_00);
      heap<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,kj::(anonymous_namespace)::InMemoryDirectory_const&,kj::String_const&,kj::Own<kj::Directory_const,decltype(nullptr)>,kj::WriteMode&>
                ((kj *)local_58,name.content.ptr,pSVar2,
                 (Own<const_kj::Directory,_std::nullptr_t> *)this_00,
                 (WriteMode *)((long)&f.exception + 4));
      Own<kj::Directory::Replacer<kj::Directory>,decltype(nullptr)>::
      Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,void>
                ((Own<kj::Directory::Replacer<kj::Directory>,decltype(nullptr)> *)this,
                 (Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,_std::nullptr_t>
                  *)local_58);
      Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,_std::nullptr_t>
      ::~Own((Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>,_std::nullptr_t>
              *)local_58);
      Own<const_kj::Directory,_std::nullptr_t>::~Own
                ((Own<const_kj::Directory,_std::nullptr_t> *)&_child1209.value.ptr);
      pRVar5 = extraout_RDX;
      goto LAB_0098d921;
    }
    pSVar2 = PathPtr::operator[]((PathPtr *)&this_local,0);
    StringPtr::StringPtr((StringPtr *)&child,pSVar2);
    name.content.size_ = (size_t)child;
    tryGetParent((InMemoryDirectory *)local_88,name,local_90);
    kj::_::readMaybe<kj::Directory_const,decltype(nullptr)>
              ((_ *)local_78,(Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_88);
    Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> *)local_88);
    pOVar3 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_78);
    if (pOVar3 != (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
      local_c8._40_8_ =
           kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                     ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_78);
      pDVar4 = Own<const_kj::Directory,_std::nullptr_t>::operator->
                         ((Own<const_kj::Directory,_std::nullptr_t> *)local_c8._40_8_);
      sVar1 = PathPtr::size((PathPtr *)&this_local);
      local_c8._24_16_ = (undefined1  [16])PathPtr::slice((PathPtr *)&this_local,1,sVar1);
      (*(pDVar4->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
                (this,pDVar4,local_c8._24_8_,local_c8._32_8_,(ulong)f.exception._4_4_);
    }
    local_c8._21_3_ = 0;
    local_c8[0x14] = pOVar3 != (Own<const_kj::Directory,_std::nullptr_t> *)0x0;
    kj::_::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
              ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_78);
    pRVar5 = extraout_RDX_00;
    if (local_c8._20_4_ != 0) goto LAB_0098d921;
  }
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
            (&(name.content.ptr)->impl);
  Impl::newDirectory((Impl *)local_d8);
  heap<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,kj::Own<kj::Directory_const,decltype(nullptr)>>
            ((kj *)local_c8,(Own<const_kj::Directory,_std::nullptr_t> *)local_d8);
  Own<kj::Directory::Replacer<kj::Directory>,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,void>
            ((Own<kj::Directory::Replacer<kj::Directory>,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,_std::nullptr_t>
              *)local_c8);
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,_std::nullptr_t>::
  ~Own((Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,_std::nullptr_t>
        *)local_c8);
  Own<const_kj::Directory,_std::nullptr_t>::~Own
            ((Own<const_kj::Directory,_std::nullptr_t> *)local_d8);
  pRVar5 = extraout_RDX_01;
LAB_0098d921:
  OVar6.ptr = pRVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to construct a directory
      return heap<ReplacerImpl<Directory>>(*this, path[0],
          impl.getWithoutLock().newDirectory(), mode);
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->replaceSubdir(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<Directory>>(impl.getWithoutLock().newDirectory());
  }